

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_internal.h
# Opt level: O3

void __thiscall
ASDCP::MXF::TrackFileWriter<ASDCP::MXF::OP1aHeader>::InitHeader
          (TrackFileWriter<ASDCP::MXF::OP1aHeader> *this,MXFVersion *mxf_ver,
          vector<ASDCP::UL,_std::allocator<ASDCP::UL>_> *conformsToSpecifications)

{
  UL *pUVar1;
  undefined8 uVar2;
  Preface *this_00;
  undefined8 *puVar3;
  Identification *this_01;
  char *__s;
  char *pcVar4;
  long lVar5;
  undefined2 uVar6;
  undefined2 uVar7;
  InterchangeObject *pIVar8;
  UL *__v;
  undefined1 auVar9 [16];
  vector<int,_std::allocator<int>_> version;
  int local_6c;
  vector<int,_std::allocator<int>_> local_68;
  long local_50 [2];
  MXFVersion *local_40;
  InterchangeObject *local_38;
  
  if (this->m_Dict == (Dictionary *)0x0) {
    __assert_fail("m_Dict",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_DCP_internal.h"
                  ,0x285,
                  "void ASDCP::MXF::TrackFileWriter<ASDCP::MXF::OP1aHeader>::InitHeader(const MXFVersion &, const std::vector<ASDCP::UL> *) [HeaderType = ASDCP::MXF::OP1aHeader]"
                 );
  }
  if (this->m_EssenceDescriptor == (FileDescriptor *)0x0) {
    __assert_fail("m_EssenceDescriptor",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_DCP_internal.h"
                  ,0x286,
                  "void ASDCP::MXF::TrackFileWriter<ASDCP::MXF::OP1aHeader>::InitHeader(const MXFVersion &, const std::vector<ASDCP::UL> *) [HeaderType = ASDCP::MXF::OP1aHeader]"
                 );
  }
  ASDCP::MXF::Primer::ClearTagList();
  this_00 = (Preface *)operator_new(0x260);
  ASDCP::MXF::Preface::Preface(this_00,this->m_Dict);
  pIVar8 = (InterchangeObject *)&this->m_HeaderPart;
  *(Preface **)&this->field_0x260 = this_00;
  ASDCP::MXF::Partition::AddChildObject(pIVar8);
  if (conformsToSpecifications != (vector<ASDCP::UL,_std::allocator<ASDCP::UL>_> *)0x0) {
    __v = *(UL **)conformsToSpecifications;
    pUVar1 = *(UL **)(conformsToSpecifications + 8);
    if (pUVar1 != __v) {
      lVar5 = *(long *)&this->field_0x260;
      *(undefined1 *)(lVar5 + 600) = 1;
      local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)(lVar5 + 0x220);
      local_40 = mxf_ver;
      local_38 = pIVar8;
      do {
        std::
        _Rb_tree<ASDCP::UL,ASDCP::UL,std::_Identity<ASDCP::UL>,std::less<ASDCP::UL>,std::allocator<ASDCP::UL>>
        ::
        _M_insert_unique_<ASDCP::UL_const&,std::_Rb_tree<ASDCP::UL,ASDCP::UL,std::_Identity<ASDCP::UL>,std::less<ASDCP::UL>,std::allocator<ASDCP::UL>>::_Alloc_node>
                  ((_Rb_tree<ASDCP::UL,ASDCP::UL,std::_Identity<ASDCP::UL>,std::less<ASDCP::UL>,std::allocator<ASDCP::UL>>
                    *)(lVar5 + 0x220),(_Base_ptr)(lVar5 + 0x228),__v,(_Alloc_node *)&local_68);
        __v = __v + 1;
        mxf_ver = local_40;
        pIVar8 = local_38;
      } while (__v != pUVar1);
    }
  }
  puVar3 = (undefined8 *)ASDCP::Dictionary::Type((MDD_t)this->m_Dict);
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)*puVar3;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)puVar3[1];
  lVar5 = *(long *)&this->field_0x260;
  *(undefined1 *)(lVar5 + 0x138) = 1;
  *(pointer *)(lVar5 + 0x139) =
       local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  *(pointer *)(lVar5 + 0x141) =
       local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  lVar5 = *(long *)&this->field_0x260;
  this->field_0x120 = *(undefined1 *)(lVar5 + 0x138);
  uVar2 = *(undefined8 *)(lVar5 + 0x141);
  *(undefined8 *)&this->field_0x121 = *(undefined8 *)(lVar5 + 0x139);
  *(undefined8 *)&this->field_0x129 = uVar2;
  if (*mxf_ver == MXFVersion_2004) {
    uVar6 = 0x102;
    uVar7 = 2;
  }
  else {
    if (*mxf_ver != MXFVersion_2011) {
      __assert_fail("mxf_ver == MXFVersion_2011",
                    "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_DCP_internal.h"
                    ,0x2a5,
                    "void ASDCP::MXF::TrackFileWriter<ASDCP::MXF::OP1aHeader>::InitHeader(const MXFVersion &, const std::vector<ASDCP::UL> *) [HeaderType = ASDCP::MXF::OP1aHeader]"
                   );
    }
    uVar6 = 0x103;
    uVar7 = 3;
  }
  *(undefined2 *)&this->field_0xd2 = uVar7;
  *(undefined2 *)(lVar5 + 0xb8) = uVar6;
  *(undefined4 *)(lVar5 + 0xbc) = 1;
  *(undefined1 *)(lVar5 + 0xc0) = 1;
  this_01 = (Identification *)operator_new(0x1d0);
  ASDCP::MXF::Identification::Identification(this_01,this->m_Dict);
  ASDCP::MXF::Partition::AddChildObject(pIVar8);
  std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>::push_back
            ((vector<Kumu::UUID,_std::allocator<Kumu::UUID>_> *)(*(long *)&this->field_0x260 + 0xf8)
             ,(value_type *)(this_01 + 0x58));
  Kumu::GenRandomValue((UUID *)(this_01 + 0xa0));
  ASDCP::MXF::UTF16String::operator=
            ((UTF16String *)(this_01 + 0xc0),(this->m_Info).CompanyName._M_dataplus._M_p);
  ASDCP::MXF::UTF16String::operator=
            ((UTF16String *)(this_01 + 0xe8),(this->m_Info).ProductName._M_dataplus._M_p);
  ASDCP::MXF::UTF16String::operator=
            ((UTF16String *)(this_01 + 0x128),(this->m_Info).ProductVersion._M_dataplus._M_p);
  this_01[0x158] = (Identification)0x1;
  uVar2 = *(undefined8 *)((this->m_Info).ProductUUID + 8);
  *(undefined8 *)(this_01 + 0x159) = *(undefined8 *)(this->m_Info).ProductUUID;
  *(undefined8 *)(this_01 + 0x161) = uVar2;
  ASDCP::MXF::UTF16String::UTF16String((UTF16String *)&local_68,"unix");
  std::__cxx11::string::_M_assign((string *)(this_01 + 0x1a8));
  this_01[0x1c8] = (Identification)0x1;
  if ((long *)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish != local_50) {
    operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish,local_50[0] + 1);
  }
  __s = (char *)ASDCP::Version();
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  pcVar4 = strchr(__s,0x2e);
  if (pcVar4 != (char *)0x0) {
    do {
      if (pcVar4 < __s) {
        __assert_fail("r >= pstr",
                      "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_DCP_internal.h"
                      ,0x4c,"std::vector<int> ASDCP::version_split(const char *)");
      }
      if (__s < pcVar4) {
        lVar5 = strtol(__s,(char **)0x0,10);
        local_6c = (int)lVar5;
        if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&local_68,
                     (iterator)
                     local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_6c);
        }
        else {
          *local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = local_6c;
          local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
      }
      __s = pcVar4 + 1;
      pcVar4 = strchr(__s,0x2e);
    } while (pcVar4 != (char *)0x0);
  }
  if (*__s != '\0') {
    lVar5 = strtol(__s,(char **)0x0,10);
    local_6c = (int)lVar5;
    if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_68,
                 (iterator)
                 local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_6c);
    }
    else {
      *local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish = local_6c;
      local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
  }
  if ((long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != 0xc) {
    __assert_fail("result.size() == 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_DCP_internal.h"
                  ,0x57,"std::vector<int> ASDCP::version_split(const char *)");
  }
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start;
  auVar9 = pshuflw(auVar9,auVar9,0xe8);
  *(int *)(this_01 + 400) = auVar9._0_4_;
  *(short *)(this_01 + 0x194) =
       (short)*(ulong *)((long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + 8);
  *(undefined2 *)(this_01 + 0x196) = 0x6a68;
  *(undefined4 *)(this_01 + 0x198) = 1;
  operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage -
                  (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
  return;
}

Assistant:

void InitHeader(const MXFVersion& mxf_ver, const std::vector<ASDCP::UL>* conformsToSpecifications = NULL)
	{
	  assert(m_Dict);
	  assert(m_EssenceDescriptor);
 
	  m_HeaderPart.m_Primer.ClearTagList();
	  m_HeaderPart.m_Preface = new Preface(m_Dict);
	  m_HeaderPart.AddChildObject(m_HeaderPart.m_Preface);

		// add conformsToSpecifications, if it exists

		if (conformsToSpecifications && conformsToSpecifications->size() > 0) {

			m_HeaderPart.m_Preface->ConformsToSpecifications.set_has_value();

			m_HeaderPart.m_Preface->ConformsToSpecifications.get().insert(
				conformsToSpecifications->begin(),
				conformsToSpecifications->end()
			);
		}

	  // Set the Operational Pattern label -- we're just starting and have no RIP or index,
	  // so we tell the world by using OP1a
	  m_HeaderPart.m_Preface->OperationalPattern = UL(m_Dict->ul(MDD_OP1a));
	  m_HeaderPart.OperationalPattern = m_HeaderPart.m_Preface->OperationalPattern;

	  if ( mxf_ver == MXFVersion_2004 )
	    {
	      m_HeaderPart.MinorVersion = MXF_2004_MinorVersion;
	      m_HeaderPart.m_Preface->Version = ((MXF_ObjectModelVersion << 8) | MXF_2004_MinorVersion);
	      m_HeaderPart.m_Preface->ObjectModelVersion = MXF_ObjectModelVersion;
	    }
	  else
	    {
	      assert(mxf_ver == MXFVersion_2011);
	      m_HeaderPart.MinorVersion = MXF_2011_MinorVersion;
	      m_HeaderPart.m_Preface->Version = ((MXF_ObjectModelVersion << 8) | MXF_2011_MinorVersion);
	      m_HeaderPart.m_Preface->ObjectModelVersion = MXF_ObjectModelVersion;
	    }

	  // Identification
	  Identification* Ident = new Identification(m_Dict);
	  m_HeaderPart.AddChildObject(Ident);
	  m_HeaderPart.m_Preface->Identifications.push_back(Ident->InstanceUID);

	  Kumu::GenRandomValue(Ident->ThisGenerationUID);
	  Ident->CompanyName = m_Info.CompanyName.c_str();
	  Ident->ProductName = m_Info.ProductName.c_str();
	  Ident->VersionString = m_Info.ProductVersion.c_str();
	  Ident->ProductUID.Set(m_Info.ProductUUID);
	  Ident->Platform = ASDCP_PLATFORM;

	  std::vector<int> version = version_split(Version());

	  Ident->ToolkitVersion.Major = version[0];
	  Ident->ToolkitVersion.Minor = version[1];
	  Ident->ToolkitVersion.Patch = version[2];
	  Ident->ToolkitVersion.Build = ASDCP_BUILD_NUMBER;
	  Ident->ToolkitVersion.Release = VersionType::RL_RELEASE;
	}